

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

bool anon_unknown.dwarf_3ea2e::cmRemoveDirectory(string *dir,bool recursive)

{
  bool bVar1;
  Status SVar2;
  ostream *poVar3;
  char *pcVar4;
  char *pcVar5;
  
  bVar1 = cmsys::SystemTools::FileIsSymlink(dir);
  if (bVar1) {
    SVar2 = cmsys::SystemTools::RemoveFile(dir);
    if (SVar2.Kind_ == Success) {
      return true;
    }
    pcVar5 = "\".\n";
    pcVar4 = "Error removing directory symlink \"";
  }
  else {
    pcVar4 = "Error removing directory \"";
    if (recursive) {
      SVar2 = cmsys::SystemTools::RemoveADirectory(dir);
      if (SVar2.Kind_ == Success) {
        return true;
      }
      pcVar5 = "\".\n";
    }
    else {
      pcVar5 = "\" without recursive option.\n";
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,pcVar4);
  poVar3 = std::operator<<(poVar3,(string *)dir);
  std::operator<<(poVar3,pcVar5);
  return false;
}

Assistant:

bool cmRemoveDirectory(const std::string& dir, bool recursive = true)
{
  if (cmSystemTools::FileIsSymlink(dir)) {
    if (!cmSystemTools::RemoveFile(dir)) {
      std::cerr << "Error removing directory symlink \"" << dir << "\".\n";
      return false;
    }
  } else if (!recursive) {
    std::cerr << "Error removing directory \"" << dir
              << "\" without recursive option.\n";
    return false;
  } else if (!cmSystemTools::RemoveADirectory(dir)) {
    std::cerr << "Error removing directory \"" << dir << "\".\n";
    return false;
  }
  return true;
}